

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<const_std::pair<const_S,_bool>_*,_const_std::pair<const_S,_bool>_*> __thiscall
frozen::map<S,_bool,_4UL,_std::less<void>_>::equal_range<int>
          (map<S,_bool,_4UL,_std::less<void>_> *this,int *key)

{
  pair<const_std::pair<const_S,_bool>_*,_const_std::pair<const_S,_bool>_*> pVar1;
  int *key_local;
  map<S,_bool,_4UL,_std::less<void>_> *this_local;
  
  pVar1 = map<S,bool,4ul,std::less<void>>::
          equal_range_impl<frozen::map<S,bool,4ul,std::less<void>>const&,int>(this,key);
  return pVar1;
}

Assistant:

constexpr std::pair<const_iterator, const_iterator>
  equal_range(KeyType const &key) const {
    return equal_range_impl(*this, key);
  }